

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O3

bool Js::DynamicProfileInfo::IsEnabled_OptionalFunctionBody
               (FunctionBody *functionBody,ScriptContext *scriptContext)

{
  byte bVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0xf4,"(scriptContext)","scriptContext");
    if (!bVar4) goto LAB_0095f267;
    *puVar6 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    bVar4 = Phases::IsEnabledForAll((Phases *)&DAT_015a4e90,DynamicProfilePhase);
    if (bVar4) {
      return false;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01599240,DynamicProfilePhase);
    if (bVar4) {
      return true;
    }
    if ((scriptContext->config).NoNative == false) {
      return true;
    }
  }
  else {
    uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar7 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_0095f267;
      *puVar6 = 0;
      pFVar7 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,DynamicProfilePhase,uVar5,pFVar7->functionId);
    if (bVar4) {
      return false;
    }
    uVar5 = FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    pFVar7 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar7 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) {
LAB_0095f267:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      pFVar7 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Phases::IsEnabled((Phases *)&DAT_01599240,DynamicProfilePhase,uVar5,pFVar7->functionId);
    if (bVar4) {
      return true;
    }
    if ((scriptContext->config).NoNative != true) {
      return true;
    }
    pUVar2 = (functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    bVar1 = pUVar2->field_0xa8;
    if ((byte)((bVar1 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6)
        != 0) {
      return true;
    }
  }
  return DynamicProfileStorage::collectInfo;
}

Assistant:

bool DynamicProfileInfo::IsEnabled_OptionalFunctionBody(const FunctionBody *const functionBody, const ScriptContext *const scriptContext)
    {
        Assert(scriptContext);

        return
            !PHASE_OFF_OPTFUNC(DynamicProfilePhase, functionBody) &&
            (
#if ENABLE_DEBUG_CONFIG_OPTIONS
                PHASE_FORCE_OPTFUNC(DynamicProfilePhase, functionBody) ||
#else
                Js::Configuration::Global.flags.ForceDynamicProfile ||
#endif
                !scriptContext->GetConfig()->IsNoNative() ||
                (functionBody && functionBody->IsInDebugMode())
#ifdef DYNAMIC_PROFILE_STORAGE
                || DynamicProfileStorage::DoCollectInfo()
#endif
                );
    }